

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O3

ObjectHeader * __thiscall
Lodtalk::VMContext::newObject
          (VMContext *this,size_t fixedSlotCount,size_t indexableSize,ObjectFormat format,
          int classIndex,int identityHash)

{
  bool bVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  size_t sVar4;
  ObjectHeader *pOVar5;
  ulong uVar6;
  uint uVar7;
  ObjectHeader OVar8;
  long lVar9;
  ObjectHeader OVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  if (format - OF_INDEXABLE_32 < 0x16) {
LAB_00142579:
    if (indexableSize == 0) {
LAB_001425fb:
      bVar1 = false;
      uVar7 = 0;
      sVar4 = 0;
      goto LAB_00142608;
    }
    if (format < OF_INDEXABLE_64) {
      bVar1 = false;
      uVar7 = 0;
      sVar4 = indexableSize;
      goto LAB_00142608;
    }
    uVar6 = *(ulong *)("double Lodtalk::VMContext::floatValueOf(Oop)" + (long)(int)format * 8 + 3);
  }
  else {
    if (OF_INDEXABLE_64 < format) {
LAB_00142775:
      abort();
    }
    if ((0x1cU >> (format & OF_COMPILED_METHOD_7) & 1) != 0) goto LAB_00142579;
    if ((0x23U >> (format & OF_COMPILED_METHOD_7) & 1) != 0) goto LAB_001425fb;
    if (format != OF_INDEXABLE_64) goto LAB_00142775;
    uVar6 = 1;
    if (indexableSize == 0) goto LAB_001425fb;
  }
  sVar4 = (-uVar6 & (uVar6 + indexableSize) - 1) / uVar6;
  if (sVar4 * uVar6 < indexableSize) {
    __assert_fail("indexableSize <= indexableSlotCount*divisor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/ObjectModel.cpp"
                  ,0x2e,
                  "ObjectHeader *Lodtalk::VMContext::newObject(size_t, size_t, ObjectFormat, int, int)"
                 );
  }
  uVar7 = (uint)indexableSize & (int)uVar6 - 1U;
  bVar1 = true;
LAB_00142608:
  OVar8 = (ObjectHeader)(sVar4 + fixedSlotCount);
  OVar10 = (ObjectHeader)0xff;
  if (0xfe >= (ulong)OVar8) {
    OVar10 = OVar8;
  }
  pOVar5 = (ObjectHeader *)allocateObjectMemory(this,(long)OVar8 * 8 + 8,0xfe < (ulong)OVar8);
  uVar3 = (uint)((ulong)pOVar5 >> 3) & 0x1fffffff;
  if (-1 < identityHash) {
    uVar3 = identityHash;
  }
  *pOVar5 = (ObjectHeader)
            ((ulong)(uint)classIndex << 0x2a |
             (ulong)(uVar7 + format & 0x1f) << 0x23 | (ulong)OVar10 | (ulong)(uVar3 << 10));
  if (0xfe < (ulong)OVar8) {
    pOVar5[-1] = OVar8;
  }
  auVar2 = _DAT_001516b0;
  if (bVar1) {
    memset(pOVar5 + 1,0,(long)OVar8 * 8);
  }
  else if (OVar8 != (ObjectHeader)0x0) {
    lVar9 = (long)OVar8 + -1;
    auVar11._8_4_ = (int)lVar9;
    auVar11._0_8_ = lVar9;
    auVar11._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar6 = 0;
    auVar11 = auVar11 ^ _DAT_001516b0;
    auVar12 = _DAT_001516a0;
    do {
      auVar13 = auVar12 ^ auVar2;
      if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                  auVar11._4_4_ < auVar13._4_4_) & 1)) {
        pOVar5[uVar6 + 1] = (ObjectHeader)&NilObject;
      }
      if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
          auVar13._12_4_ <= auVar11._12_4_) {
        pOVar5[uVar6 + 2] = (ObjectHeader)&NilObject;
      }
      uVar6 = uVar6 + 2;
      lVar9 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar9 + 2;
    } while (((long)OVar8 + 1U & 0xfffffffffffffffe) != uVar6);
  }
  return pOVar5;
}

Assistant:

ObjectHeader *VMContext::newObject(size_t fixedSlotCount, size_t indexableSize, ObjectFormat format, int classIndex, int identityHash)
{
	// Compute the header size.
	size_t indexableSlotCount = 0;
	auto indexableSlotSize = variableSlotSizeFor(format);
	auto indexableFormatExtraBits = 0;
	bool hasPrimitiveData = false;
	if(indexableSlotSize && indexableSize)
	{
		if(format < OF_INDEXABLE_NATIVE_FIRST)
		{
			indexableSlotCount = indexableSize;
		}
#ifndef OBJECT_MODEL_SPUR_64
		else if(format == OF_INDEXABLE_64)
		{
			indexableSlotCount = indexableSize * 2;
			hasPrimitiveData = true;
		}
#endif
		else
		{
			hasPrimitiveData = true;
			size_t divisor = variableSlotDivisor(format);
			size_t mask = (divisor - 1);

		 	indexableSlotCount = ((indexableSize + divisor - 1) & (~mask)) / divisor;
			indexableFormatExtraBits = int(indexableSize & mask);
			assert(indexableSize <= indexableSlotCount*divisor);
		}
	}